

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::_save_jpeg
          (CImg<unsigned_char> *this,FILE *file,char *filename,uint quality)

{
  bool bVar1;
  CImg<unsigned_char> *pCVar2;
  CImgIOException *this_00;
  pointer_____offset_0x10___ *ppuVar3;
  char *pcVar4;
  char *pcVar5;
  
  if (file == (FILE *)0x0 && filename == (char *)0x0) {
    this_00 = (CImgIOException *)__cxa_allocate_exception(0x4008);
    pcVar4 = "non-";
    if (this->_is_shared != false) {
      pcVar4 = "";
    }
    CImgArgumentException::CImgArgumentException
              ((CImgArgumentException *)this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::save_jpeg() : Specified filename is (null)."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar4,"unsigned char");
    ppuVar3 = &CImgArgumentException::typeinfo;
  }
  else {
    bVar1 = is_empty(this);
    if (bVar1) {
      this_00 = (CImgIOException *)__cxa_allocate_exception(0x4008);
      pcVar4 = "non-";
      if (this->_is_shared != false) {
        pcVar4 = "";
      }
      pcVar5 = "(FILE*)";
      if (filename != (char *)0x0) {
        pcVar5 = filename;
      }
      CImgInstanceException::CImgInstanceException
                ((CImgInstanceException *)this_00,
                 "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::save_jpeg() : Empty instance, for file \'%s\'."
                 ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                 (ulong)this->_spectrum,this->_data,pcVar4,"unsigned char",pcVar5);
      ppuVar3 = &CImgInstanceException::typeinfo;
    }
    else {
      if (1 < this->_depth) {
        pcVar4 = "non-";
        if (this->_is_shared != false) {
          pcVar4 = "";
        }
        pcVar5 = "(FILE*)";
        if (filename != (char *)0x0) {
          pcVar5 = filename;
        }
        cimg::warn("[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::save_jpeg() : Instance is volumetric, only the first slice will be saved in file \'%s\'."
                   ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                   (ulong)this->_spectrum,this->_data,pcVar4,"unsigned char",pcVar5);
      }
      if (file == (FILE *)0x0) {
        pCVar2 = save_other(this,filename,quality);
        return pCVar2;
      }
      this_00 = (CImgIOException *)__cxa_allocate_exception(0x4008);
      pcVar4 = "non-";
      if (this->_is_shared != false) {
        pcVar4 = "";
      }
      CImgIOException::CImgIOException
                (this_00,
                 "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::save_jpeg() : Unable to save data in \'(*FILE)\' unless libjpeg is enabled."
                 ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                 (ulong)this->_spectrum,this->_data,pcVar4,"unsigned char");
      ppuVar3 = &CImgIOException::typeinfo;
    }
  }
  __cxa_throw(this_00,ppuVar3,std::exception::~exception);
}

Assistant:

const CImg<T>& _save_jpeg(std::FILE *const file, const char *const filename, const unsigned int quality) const {
      if (!file && !filename)
        throw CImgArgumentException(_cimg_instance
                                    "save_jpeg() : Specified filename is (null).",
                                    cimg_instance);
      if (is_empty())
        throw CImgInstanceException(_cimg_instance
                                    "save_jpeg() : Empty instance, for file '%s'.",
                                    cimg_instance,
                                    filename?filename:"(FILE*)");
      if (_depth>1)
        cimg::warn(_cimg_instance
                   "save_jpeg() : Instance is volumetric, only the first slice will be saved in file '%s'.",
                   cimg_instance,
                   filename?filename:"(FILE*)");

#ifndef cimg_use_jpeg
      if (!file) return save_other(filename,quality);
      else throw CImgIOException(_cimg_instance
                                 "save_jpeg() : Unable to save data in '(*FILE)' unless libjpeg is enabled.",
                                 cimg_instance);
#else
      unsigned int dimbuf = 0;
      J_COLOR_SPACE colortype = JCS_RGB;

      switch(_spectrum) {
      case 1 : dimbuf = 1; colortype = JCS_GRAYSCALE; break;
      case 2 : dimbuf = 3; colortype = JCS_RGB; break;
      case 3 : dimbuf = 3; colortype = JCS_RGB; break;
      default: dimbuf = 4; colortype = JCS_CMYK; break;
      }

      // Call libjpeg functions
      struct jpeg_compress_struct cinfo;
      struct jpeg_error_mgr jerr;
      cinfo.err = jpeg_std_error(&jerr);
      jpeg_create_compress(&cinfo);
      std::FILE *const nfile = file?file:cimg::fopen(filename,"wb");
      jpeg_stdio_dest(&cinfo,nfile);
      cinfo.image_width = _width;
      cinfo.image_height = _height;
      cinfo.input_components = dimbuf;
      cinfo.in_color_space = colortype;
      jpeg_set_defaults(&cinfo);
      jpeg_set_quality(&cinfo,quality<100?quality:100,TRUE);
      jpeg_start_compress(&cinfo,TRUE);

      JSAMPROW row_pointer[1];
      CImg<ucharT> buffer(_width*dimbuf);

      while (cinfo.next_scanline < cinfo.image_height) {
        unsigned char *ptrd = buffer._data;

        // Fill pixel buffer
        switch (_spectrum) {
        case 1 : { // Greyscale images
          const T *ptr_g = data(0, cinfo.next_scanline);
          for(unsigned int b = 0; b < cinfo.image_width; b++)
            *(ptrd++) = (unsigned char)*(ptr_g++);
        } break;
        case 2 : { // RG images
          const T *ptr_r = data(0,cinfo.next_scanline,0,0),
            *ptr_g = data(0,cinfo.next_scanline,0,1);
          for(unsigned int b = 0; b < cinfo.image_width; ++b) {
            *(ptrd++) = (unsigned char)*(ptr_r++);
            *(ptrd++) = (unsigned char)*(ptr_g++);
            *(ptrd++) = 0;
          }
        } break;
        case 3 : { // RGB images
          const T *ptr_r = data(0,cinfo.next_scanline,0,0),
            *ptr_g = data(0,cinfo.next_scanline,0,1),
            *ptr_b = data(0,cinfo.next_scanline,0,2);
          for(unsigned int b = 0; b < cinfo.image_width; ++b) {
            *(ptrd++) = (unsigned char)*(ptr_r++);
            *(ptrd++) = (unsigned char)*(ptr_g++);
            *(ptrd++) = (unsigned char)*(ptr_b++);
          }
        } break;
        default : { // CMYK images
          const T *ptr_r = data(0,cinfo.next_scanline,0,0),
            *ptr_g = data(0,cinfo.next_scanline,0,1),
            *ptr_b = data(0,cinfo.next_scanline,0,2),
            *ptr_a = data(0,cinfo.next_scanline,0,3);
          for(unsigned int b = 0; b < cinfo.image_width; ++b) {
            *(ptrd++) = (unsigned char)*(ptr_r++);
            *(ptrd++) = (unsigned char)*(ptr_g++);
            *(ptrd++) = (unsigned char)*(ptr_b++);
            *(ptrd++) = (unsigned char)*(ptr_a++);
          }
        }
        }
        *row_pointer = buffer._data;
        jpeg_write_scanlines(&cinfo,row_pointer,1);
      }
      jpeg_finish_compress(&cinfo);
      if (!file) cimg::fclose(nfile);
      jpeg_destroy_compress(&cinfo);
      return *this;
#endif
    }